

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O3

void __thiscall TPZTensor<TFad<6,_double>_>::TPZDecomposed::Print(TPZDecomposed *this,ostream *out)

{
  uint uVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  ostream *poVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  char *pcVar9;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"TPZTensor::Decomposed Eigenvalues (",0x23)
  ;
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," distinct):",0xb);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  uVar4 = 0;
  uVar6 = 0;
  do {
    uVar1 = (this->fGeometricMultiplicity).super_TPZVec<unsigned_int>.fStore[uVar4];
    std::__ostream_insert<char,std::char_traits<char>>(out,"Eigenvalue: ",0xc);
    poVar5 = std::ostream::_M_insert<double>
                       ((this->fEigenvalues).super_TPZVec<TFad<6,_double>_>.fStore[uVar4].val_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," (",2);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," time",5);
    uVar7 = (ulong)(1 < uVar1);
    pcVar9 = "";
    if (1 < uVar1) {
      pcVar9 = "s";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar9,uVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(out,"Eigenvector",0xb);
    std::__ostream_insert<char,std::char_traits<char>>(out,pcVar9,uVar7);
    std::__ostream_insert<char,std::char_traits<char>>(out,":",1);
    cVar2 = (char)out;
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    uVar3 = uVar6;
    if (((this->fEigenvectors).super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>.fNElements == 0) ||
       ((((this->fEigenvectors).super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>.fStore)->
        super_TPZVec<TFad<6,_double>_>).fNElements == 0)) {
      std::__ostream_insert<char,std::char_traits<char>>(out," Not computed.",0xe);
      std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
    }
    else if (uVar1 != 0) {
      uVar3 = uVar1 + uVar6;
      uVar8 = uVar1;
      do {
        poVar5 = std::ostream::_M_insert<double>
                           (((this->fEigenvectors).super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>.
                             fStore[uVar6].super_TPZVec<TFad<6,_double>_>.fStore)->val_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        poVar5 = std::ostream::_M_insert<double>
                           ((this->fEigenvectors).super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>.
                            fStore[uVar6].super_TPZVec<TFad<6,_double>_>.fStore[1].val_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        poVar5 = std::ostream::_M_insert<double>
                           ((this->fEigenvectors).super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>.
                            fStore[uVar6].super_TPZVec<TFad<6,_double>_>.fStore[2].val_);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        uVar6 = uVar6 + 1;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    }
    uVar6 = uVar3;
    std::__ostream_insert<char,std::char_traits<char>>(out,"Eigentensor:",0xc);
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    TPZTensor<TFad<6,_double>_>::Print
              ((this->fEigentensors).super_TPZVec<TPZTensor<TFad<6,_double>_>_>.fStore + uVar4,out);
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    uVar4 = uVar1 + uVar4;
  } while (uVar4 < 3);
  return;
}

Assistant:

void Print(std::ostream &out) const {
#ifdef PZ_LOG
            if (fDistinctEigenvalues == 0 || fDistinctEigenvalues > 3) {
                std::stringstream str;
                str << "TPZTensor::Decomposed::Print Invalid number of distinct eigenvalues: " << fDistinctEigenvalues << std::endl;
                LOGPZ_DEBUG(loggerr, str.str());
            }
#endif
            out << "TPZTensor::Decomposed Eigenvalues (" << fDistinctEigenvalues << " distinct):" << std::endl;
            unsigned int vIndex = 0;
            unsigned int lambda = 0;
            do {
                const unsigned int geoMult(fGeometricMultiplicity[lambda]);
#ifdef PZ_LOG
                if (geoMult == 0 || geoMult > 3) {
                    std::stringstream str;
                    str << "TPZTensor::Decomposed::Print Invalid geometric multiplicity (" << geoMult << ") for eigenvalue " << fEigenvalues[lambda] << std::endl;
                    LOGPZ_DEBUG(loggerr, str.str());
                }
#endif
                out << "Eigenvalue: " << fEigenvalues[lambda] << " (" << geoMult << " time" << (geoMult > 1 ? "s" : "") << ")" << std::endl;
                out << "Eigenvector" << (geoMult > 1 ? "s" : "") << ":" << std::endl;
                if (fEigenvectors.size() == 0 || fEigenvectors[0].size() == 0) {
                    out << " Not computed." << std::endl;
                } else {
                    for (unsigned int v = 0; v < geoMult; ++v) {
                        out << fEigenvectors[vIndex][0] << " ";
                        out << fEigenvectors[vIndex][1] << " ";
                        out << fEigenvectors[vIndex][2] << std::endl;
                        ++vIndex;
                    }
                }
                out << "Eigentensor:" << std::endl;
                fEigentensors[lambda].Print(out);
                out << std::endl;
                lambda += geoMult; // Go to next distinct eigenvalue
#ifdef PZDEBUG
                if (lambda > 3) {
                    std::stringstream str;
                    str << "TPZTensor::Decomposed::Print Total geometric multiplicity greater than expected!" << std::endl;
                    LOGPZ_ERROR(loggerr, str.str());
                }
#endif
            } while (lambda < 3);
        }